

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlXPtrNewContext(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_78;
  PyObject *local_70;
  PyObject *local_68;
  undefined *local_60;
  PyObject *pyobj_origin;
  xmlNodePtr origin;
  PyObject *pyobj_here;
  xmlNodePtr here;
  PyObject *pyobj_doc;
  xmlDocPtr doc;
  xmlXPathContextPtr c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = libxml_deprecationWarning("xmlXPtrNewContext");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _PyArg_ParseTuple_SizeT(py_retval,"OOO:xmlXPtrNewContext",&here,&origin,&local_60);
    if (iVar1 == 0) {
      self_local = (PyObject *)0x0;
    }
    else {
      if (here == (xmlNodePtr)&_Py_NoneStruct) {
        local_68 = (PyObject *)0x0;
      }
      else {
        local_68 = (PyObject *)here->name;
      }
      pyobj_doc = local_68;
      if (origin == (xmlNodePtr)&_Py_NoneStruct) {
        local_70 = (PyObject *)0x0;
      }
      else {
        local_70 = (PyObject *)origin->name;
      }
      pyobj_here = local_70;
      if (local_60 == &_Py_NoneStruct) {
        local_78 = (PyObject *)0x0;
      }
      else {
        local_78 = *(PyObject **)(local_60 + 0x10);
      }
      pyobj_origin = local_78;
      doc = (xmlDocPtr)xmlXPtrNewContext(local_68,local_70,local_78);
      self_local = libxml_xmlXPathContextPtrWrap((xmlXPathContextPtr)doc);
    }
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlXPtrNewContext(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    xmlXPathContextPtr c_retval;
    xmlDocPtr doc;
    PyObject *pyobj_doc;
    xmlNodePtr here;
    PyObject *pyobj_here;
    xmlNodePtr origin;
    PyObject *pyobj_origin;

    if (libxml_deprecationWarning("xmlXPtrNewContext") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"OOO:xmlXPtrNewContext", &pyobj_doc, &pyobj_here, &pyobj_origin))
        return(NULL);
    doc = (xmlDocPtr) PyxmlNode_Get(pyobj_doc);
    here = (xmlNodePtr) PyxmlNode_Get(pyobj_here);
    origin = (xmlNodePtr) PyxmlNode_Get(pyobj_origin);

    c_retval = xmlXPtrNewContext(doc, here, origin);
    py_retval = libxml_xmlXPathContextPtrWrap((xmlXPathContextPtr) c_retval);
    return(py_retval);
}